

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VCFilter>::emplace<VCFilter_const&>
          (QGenericArrayOps<VCFilter> *this,qsizetype i,VCFilter *args)

{
  VCFilter **ppVVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  VCFilter tmp;
  Inserter local_4c8;
  VCFilter local_478;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<VCFilter>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0024d82e:
    memset(&local_478,0xaa,0x448);
    VCFilter::VCFilter(&local_478,args);
    bVar5 = (this->super_QArrayDataPointer<VCFilter>).size != 0;
    QArrayDataPointer<VCFilter>::detachAndGrow
              (&this->super_QArrayDataPointer<VCFilter>,(uint)(i == 0 && bVar5),1,(VCFilter **)0x0,
               (QArrayDataPointer<VCFilter> *)0x0);
    if (i == 0 && bVar5) {
      VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr + -1,&local_478);
      ppVVar1 = &(this->super_QArrayDataPointer<VCFilter>).ptr;
      *ppVVar1 = *ppVVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<VCFilter>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_4c8.sourceCopyConstruct = 0;
      local_4c8.nSource = 0;
      local_4c8.move = 0;
      local_4c8.sourceCopyAssign = 0;
      local_4c8.end = (VCFilter *)0x0;
      local_4c8.last = (VCFilter *)0x0;
      local_4c8.where = (VCFilter *)0x0;
      local_4c8.begin = (this->super_QArrayDataPointer<VCFilter>).ptr;
      local_4c8.size = (this->super_QArrayDataPointer<VCFilter>).size;
      local_4c8.data = &this->super_QArrayDataPointer<VCFilter>;
      Inserter::insertOne(&local_4c8,i,&local_478);
      (local_4c8.data)->ptr = local_4c8.begin;
      (local_4c8.data)->size = local_4c8.size;
    }
    VCFilter::~VCFilter(&local_478);
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<VCFilter>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<VCFilter>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x1de5d6e3f8868a47)) {
      VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((VCFilter *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<VCFilter>).ptr)) goto LAB_0024d82e;
      VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr + -1,args);
      ppVVar1 = &(this->super_QArrayDataPointer<VCFilter>).ptr;
      *ppVVar1 = *ppVVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<VCFilter>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }